

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2b3501::SuperBlockSizeTestLarge::SetUp(SuperBlockSizeTestLarge *this)

{
  libaom_test::EncoderTest::InitializeConfig
            (&this->super_EncoderTest,*(TestMode *)&(this->super_EncoderTest).field_0x3dc);
  (this->super_EncoderTest).cfg_.g_timebase.num = 1;
  (this->super_EncoderTest).cfg_.g_timebase.den = 0x1e;
  (this->super_EncoderTest).cfg_.rc_end_usage = this->rc_end_usage_;
  (this->super_EncoderTest).cfg_.g_threads = 1;
  (this->super_EncoderTest).cfg_.g_lag_in_frames = 0x23;
  (this->super_EncoderTest).cfg_.rc_target_bitrate = 1000;
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(encoding_mode_);
    const aom_rational timebase = { 1, 30 };
    cfg_.g_timebase = timebase;
    cfg_.rc_end_usage = rc_end_usage_;
    cfg_.g_threads = 1;
    cfg_.g_lag_in_frames = 35;
    cfg_.rc_target_bitrate = 1000;
  }